

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O1

void __thiscall xe::ContainerFormatParser::advance(ContainerFormatParser *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  
  if (this->m_element != CONTAINERELEMENT_INCOMPLETE) {
    iVar2 = this->m_elementLen;
    (this->m_buf).m_back = ((this->m_buf).m_back + iVar2) % (this->m_buf).m_size;
    (this->m_buf).m_numElements = (this->m_buf).m_numElements - iVar2;
    this->m_element = CONTAINERELEMENT_INCOMPLETE;
    this->m_elementLen = 0;
    (this->m_attribute)._M_string_length = 0;
    *(this->m_attribute)._M_dataplus._M_p = '\0';
    (this->m_value)._M_string_length = 0;
    *(this->m_value)._M_dataplus._M_p = '\0';
  }
  do {
    iVar2 = this->m_elementLen;
    iVar3 = (this->m_buf).m_numElements;
    uVar6 = 0xffffffff;
    if (iVar2 < iVar3) {
      uVar6 = (uint)(this->m_buf).m_buffer[((this->m_buf).m_back + iVar2) % (this->m_buf).m_size];
    }
    if (uVar6 == 0xffffffff) {
      bVar5 = true;
      if ((0 < iVar2) && (this->m_state == STATE_DATA)) {
        this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
      }
    }
    else {
      iVar1 = iVar2 + 1;
      this->m_elementLen = iVar1;
      if (uVar6 == 0) {
        if (iVar2 == 0) {
          this->m_element = CONTAINERELEMENT_END_OF_STRING;
        }
        else if (this->m_state == STATE_CONTAINER_LINE) {
          parseContainerLine(this);
        }
        else {
          this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
        }
        bVar5 = true;
      }
      else {
        if ((uVar6 == 0xd) || (uVar6 == 10)) {
          uVar7 = 0xffffffff;
          if (iVar1 < iVar3) {
            uVar7 = (uint)(this->m_buf).m_buffer
                          [(iVar1 + (this->m_buf).m_back) % (this->m_buf).m_size];
          }
          if (uVar6 == 10) {
LAB_001144ba:
            if (this->m_state == STATE_CONTAINER_LINE) {
              parseContainerLine(this);
            }
            else {
              this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
            }
            this->m_state = STATE_AT_LINE_START;
            bVar5 = true;
            bVar4 = false;
          }
          else {
            bVar5 = false;
            bVar4 = true;
            if ((uVar7 != 0xffffffff) && (uVar7 != 10)) goto LAB_001144ba;
          }
          if (!bVar4) goto LAB_00114539;
        }
        else if (this->m_state == STATE_AT_LINE_START) {
          this->m_state = (uVar6 != 0x23) + STATE_CONTAINER_LINE;
        }
        bVar5 = false;
      }
    }
LAB_00114539:
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void ContainerFormatParser::advance (void)
{
	if (m_element != CONTAINERELEMENT_INCOMPLETE)
	{
		m_buf.popBack(m_elementLen);

		m_element		= CONTAINERELEMENT_INCOMPLETE;
		m_elementLen	= 0;
		m_attribute.clear();
		m_value.clear();
	}

	for (;;)
	{
		int curChar = getChar(m_elementLen);

		if (curChar != (int)END_OF_BUFFER)
			m_elementLen += 1;

		if (curChar == END_OF_STRING)
		{
			if (m_elementLen == 1)
				m_element = CONTAINERELEMENT_END_OF_STRING;
			else if (m_state == STATE_CONTAINER_LINE)
				parseContainerLine();
			else
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == (int)END_OF_BUFFER)
		{
			if (m_elementLen > 0 && m_state == STATE_DATA)
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == '\r' || curChar == '\n')
		{
			// Check for \r\n
			int nextChar = getChar(m_elementLen);
			if (curChar == '\n' || (nextChar != (int)END_OF_BUFFER && nextChar != '\n'))
			{
				if (m_state == STATE_CONTAINER_LINE)
					parseContainerLine();
				else
					m_element = CONTAINERELEMENT_TEST_LOG_DATA;

				m_state = STATE_AT_LINE_START;
				break;
			}
			// else handle following end or \n in next iteration.
		}
		else if (m_state == STATE_AT_LINE_START)
		{
			DE_ASSERT(m_elementLen == 1);
			m_state = (curChar == '#') ? STATE_CONTAINER_LINE : STATE_DATA;
		}
	}
}